

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O1

int elf_uncompress_lzma(backtrace_state *state,uchar *compressed,size_t compressed_size,
                       backtrace_error_callback error_callback,void *data,uchar **uncompressed,
                       size_t *uncompressed_size)

{
  uchar *puVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  sbyte sVar7;
  sbyte sVar8;
  byte bVar15;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  uint16_t *probs;
  byte *pbVar14;
  ulong uVar16;
  byte *pbVar17;
  size_t __n;
  byte bVar18;
  uint32_t i;
  uint uVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  size_t sVar23;
  ulong uVar24;
  ulong uVar25;
  byte *pbVar26;
  ulong uVar27;
  ulong uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  size_t size;
  long lVar32;
  uint32_t val;
  uint uVar33;
  int iVar34;
  bool bVar35;
  bool bVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  ulong local_100;
  uint16_t *local_88;
  uint local_74;
  uint local_64;
  uint local_54;
  uint32_t local_44;
  size_t local_40;
  uint32_t local_34;
  ulong uVar13;
  
  if (compressed_size < 0x18) {
    return 0;
  }
  lVar22 = 6;
  iVar9 = bcmp(compressed,anon_var_dwarf_6fcd2,6);
  if (iVar9 != 0) {
    return 0;
  }
  if (compressed[6] != '\0') {
    return 0;
  }
  bVar2 = compressed[7];
  if (7 < bVar2) {
    return 0;
  }
  uVar13 = 0xffffffffffffffff;
  do {
    uVar10 = (uint)(uVar13 >> 8) & 0xffffff ^
             *(uint *)(elf_crc32_crc32_table + (ulong)(byte)(compressed[lVar22] ^ (byte)uVar13) * 4)
    ;
    uVar13 = (ulong)uVar10;
    lVar22 = lVar22 + 1;
  } while (lVar22 != 8);
  if ((uVar10 ^ *(uint *)(compressed + 8)) != 0xffffffff) {
    return 0;
  }
  if (*(short *)(compressed + (compressed_size - 2)) != 0x5a59) {
    return 0;
  }
  if (compressed[compressed_size - 4] != '\0') {
    return 0;
  }
  if (compressed[compressed_size - 3] != bVar2) {
    return 0;
  }
  uVar13 = 0xffffffffffffffff;
  lVar22 = -8;
  do {
    uVar10 = (uint)(uVar13 >> 8) & 0xffffff ^
             *(uint *)(elf_crc32_crc32_table +
                      (ulong)(byte)(compressed[lVar22 + compressed_size] ^ (byte)uVar13) * 4);
    uVar13 = (ulong)uVar10;
    lVar22 = lVar22 + 1;
  } while (lVar22 != -2);
  if ((uVar10 ^ *(uint *)(compressed + (compressed_size - 0xc))) != 0xffffffff) {
    return 0;
  }
  if (compressed_size - 0xc < (long)*(int *)(compressed + (compressed_size - 8)) * 4 + 0x10U) {
    return 0;
  }
  lVar22 = compressed_size + (long)*(int *)(compressed + (compressed_size - 8)) * -4;
  uVar13 = lVar22 - 0x10;
  if (compressed[lVar22 + -0x10] != '\0') {
    return 0;
  }
  if (compressed[lVar22 + -0xf] != '\x01') {
    if (compressed[lVar22 + -0xf] == '\0') {
      *uncompressed = (uchar *)0x0;
      *uncompressed_size = 0;
      return 1;
    }
    return 0;
  }
  pbVar17 = compressed + lVar22 + -0x10;
  local_40 = lVar22 - 0xe;
  iVar9 = 0;
  uVar27 = 0;
  uVar28 = local_40;
  do {
    bVar35 = true;
    if (compressed_size <= uVar28) break;
    uVar27 = uVar27 | (long)(int)((compressed[uVar28] & 0x7f) << ((byte)iVar9 & 0x1f));
    if (-1 < (char)compressed[uVar28]) {
      local_40 = uVar28 + 1;
      uVar28 = uVar27 + 3 & 0xfffffffffffffffc;
      bVar35 = false;
      goto LAB_001139d4;
    }
    iVar9 = iVar9 + 7;
    uVar28 = uVar28 + 1;
  } while (iVar9 != 0x3f);
  uVar28 = 0;
LAB_001139d4:
  if (bVar35) {
    return 0;
  }
  iVar9 = 0;
  size = 0;
  sVar23 = local_40;
  do {
    bVar35 = true;
    if (compressed_size <= sVar23) break;
    size = size | (long)(int)((compressed[sVar23] & 0x7f) << ((byte)iVar9 & 0x1f));
    if (-1 < (char)compressed[sVar23]) {
      local_40 = sVar23 + 1;
      bVar35 = false;
      break;
    }
    iVar9 = iVar9 + 7;
    sVar23 = sVar23 + 1;
  } while (iVar9 != 0x3f);
  if (bVar35) {
    return 0;
  }
  local_40 = local_40 + 3 & 0xfffffffffffffffc;
  uVar10 = 0;
  if (local_40 != uVar13 && -1 < (long)(local_40 - uVar13)) {
    uVar27 = 0xffffffffffffffff;
    do {
      uVar10 = (uint)(uVar27 >> 8) & 0xffffff ^
               *(uint *)(elf_crc32_crc32_table + (ulong)(byte)(*pbVar17 ^ (byte)uVar27) * 4);
      uVar27 = (ulong)uVar10;
      pbVar17 = pbVar17 + 1;
    } while (pbVar17 < compressed + local_40);
    uVar10 = ~uVar10;
  }
  if (uVar10 != *(uint *)(compressed + local_40)) {
    return 0;
  }
  local_40 = local_40 + 4;
  if (local_40 != compressed_size - 0xc) {
    return 0;
  }
  pbVar17 = (byte *)tcmalloc_backtrace_alloc(state,size,error_callback,data);
  if (pbVar17 == (byte *)0x0) {
    return 0;
  }
  *uncompressed = pbVar17;
  *uncompressed_size = size;
  probs = (uint16_t *)tcmalloc_backtrace_alloc(state,0x6e6c,error_callback,data);
  if (probs == (uint16_t *)0x0) goto LAB_00114a78;
  local_40 = 0xc;
  uVar27 = (ulong)((uint)compressed[0xc] * 4);
  if ((compressed_size < uVar27 + 0x10) || (bVar18 = compressed[0xd], (bVar18 & 0x3c) != 0))
  goto LAB_00114a78;
  if ((bVar18 & 0x40) != 0) {
    local_40 = 0xe;
    uVar25 = 0xf;
    do {
      if ((0xe - compressed_size) + uVar25 == 0xf) break;
      sVar23 = uVar25;
      if (-1 < (char)compressed[uVar25 - 1]) goto LAB_00113b8e;
      uVar25 = uVar25 + 1;
    } while ((int)uVar25 != 0x18);
    goto LAB_00114a78;
  }
  uVar25 = 0xe;
  sVar23 = local_40;
LAB_00113b8e:
  local_40 = sVar23;
  if ((char)bVar18 < '\0') {
    iVar9 = 9;
    uVar24 = uVar25;
    do {
      local_40 = uVar25;
      if (compressed_size <= uVar24) break;
      if (-1 < (char)compressed[uVar24]) {
        uVar25 = uVar24 + 1;
        local_40 = uVar25;
        goto LAB_00113bbf;
      }
      uVar24 = uVar24 + 1;
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
    goto LAB_00114a78;
  }
LAB_00113bbf:
  if (((((bVar18 & 3) != 0) || (uVar27 + 0x10 <= uVar25 + 2)) || (compressed[uVar25] != '!')) ||
     ((compressed[uVar25 + 1] != '\x01' || (0x28 < compressed[uVar25 + 2])))) goto LAB_00114a78;
  uVar24 = uVar25 + 3;
  if (uVar25 + 3 < uVar27 + 0xc) {
    do {
      if (compressed[uVar25 + 3] != '\0') goto LAB_00114a78;
      uVar25 = uVar25 + 1;
      uVar24 = uVar27 + 0xc;
    } while (uVar27 + 9 != uVar25);
  }
  if (compressed[0xc] == 0) {
    uVar10 = 0;
  }
  else {
    pbVar26 = compressed + 0xc;
    pbVar14 = pbVar26 + uVar27;
    uVar27 = 0xffffffffffffffff;
    do {
      uVar10 = (uint)(uVar27 >> 8) & 0xffffff ^
               *(uint *)(elf_crc32_crc32_table + (ulong)(byte)(*pbVar26 ^ (byte)uVar27) * 4);
      uVar27 = (ulong)uVar10;
      pbVar26 = pbVar26 + 1;
    } while (pbVar26 < pbVar14);
    uVar10 = ~uVar10;
  }
  if (uVar10 != *(uint *)(compressed + uVar24)) goto LAB_00114a78;
  uVar24 = uVar24 + 4;
  uVar29 = 0;
  sVar7 = 0;
  uVar10 = 0;
  bVar18 = 0;
  local_100 = 0;
  uVar27 = 0;
  auVar54 = _DAT_00134040;
  local_88 = probs + 0x322;
  do {
    if (compressed_size <= uVar24) goto LAB_0011497d;
    local_44 = 0xffffffff;
    local_34 = 0;
    bVar3 = compressed[uVar24];
    uVar25 = uVar24 + 1;
    if (bVar3 == 0) {
      iVar9 = 6;
      uVar24 = uVar25;
    }
    else {
      if (0xdf < bVar3) {
        local_100 = uVar27;
      }
      if (bVar3 == 1) {
        local_100 = uVar27;
      }
      if ((char)bVar3 < '\0') {
        uVar16 = uVar24 + 5;
        if (uVar16 < compressed_size) {
          bVar4 = compressed[uVar24 + 1];
          bVar5 = compressed[uVar24 + 2];
          uVar6 = *(ushort *)(compressed + uVar24 + 3);
          if (bVar3 < 0xc0) {
LAB_00113ea0:
            if (0x9f < bVar3) {
              lVar22 = 7;
              auVar37 = _DAT_00134030;
              auVar38 = _DAT_00138090;
              auVar39 = _DAT_00138080;
              auVar40 = _DAT_00138070;
              do {
                auVar41 = auVar37 ^ auVar54;
                iVar9 = auVar41._0_4_;
                iVar11 = auVar41._8_4_;
                auVar46._4_4_ = iVar9;
                auVar46._0_4_ = iVar9;
                auVar46._8_4_ = iVar11;
                auVar46._12_4_ = iVar11;
                auVar50._0_4_ = -(uint)(iVar9 < -0x7fffc8ca);
                auVar50._4_4_ = -(uint)(iVar9 < -0x7fffc8ca);
                auVar50._8_4_ = -(uint)(iVar11 < -0x7fffc8ca);
                auVar50._12_4_ = -(uint)(iVar11 < -0x7fffc8ca);
                auVar42._0_4_ = -(uint)(auVar41._4_4_ == -0x80000000);
                auVar42._4_4_ = -(uint)(auVar41._4_4_ == -0x80000000);
                auVar42._8_4_ = -(uint)(auVar41._12_4_ == -0x80000000);
                auVar42._12_4_ = -(uint)(auVar41._12_4_ == -0x80000000);
                auVar42 = auVar42 & auVar50;
                auVar41 = pshuflw(auVar46,auVar42,0xe8);
                auVar41 = packssdw(auVar41,auVar41);
                if ((auVar41 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  probs[lVar22 + -7] = 0x400;
                }
                auVar41 = packssdw(auVar42,auVar42);
                auVar41 = packssdw(auVar41,auVar41);
                if ((auVar41._0_4_ >> 0x10 & 1) != 0) {
                  probs[lVar22 + -6] = 0x400;
                }
                auVar41 = auVar38 ^ auVar54;
                iVar9 = auVar41._0_4_;
                iVar11 = auVar41._8_4_;
                auVar47._4_4_ = iVar9;
                auVar47._0_4_ = iVar9;
                auVar47._8_4_ = iVar11;
                auVar47._12_4_ = iVar11;
                auVar51._0_4_ = -(uint)(iVar9 < -0x7fffc8ca);
                auVar51._4_4_ = -(uint)(iVar9 < -0x7fffc8ca);
                auVar51._8_4_ = -(uint)(iVar11 < -0x7fffc8ca);
                auVar51._12_4_ = -(uint)(iVar11 < -0x7fffc8ca);
                auVar43._0_4_ = -(uint)(auVar41._4_4_ == -0x80000000);
                auVar43._4_4_ = -(uint)(auVar41._4_4_ == -0x80000000);
                auVar43._8_4_ = -(uint)(auVar41._12_4_ == -0x80000000);
                auVar43._12_4_ = -(uint)(auVar41._12_4_ == -0x80000000);
                auVar43 = auVar43 & auVar51;
                auVar41 = packssdw(auVar47,auVar43);
                auVar41 = packssdw(auVar41,auVar41);
                if ((auVar41 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  probs[lVar22 + -5] = 0x400;
                }
                auVar41 = pshufhw(auVar43,auVar43,0x84);
                auVar41 = packssdw(auVar41,auVar41);
                if ((auVar41 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  probs[lVar22 + -4] = 0x400;
                }
                auVar41 = auVar39 ^ auVar54;
                iVar9 = auVar41._0_4_;
                iVar11 = auVar41._8_4_;
                auVar48._4_4_ = iVar9;
                auVar48._0_4_ = iVar9;
                auVar48._8_4_ = iVar11;
                auVar48._12_4_ = iVar11;
                auVar52._0_4_ = -(uint)(iVar9 < -0x7fffc8ca);
                auVar52._4_4_ = -(uint)(iVar9 < -0x7fffc8ca);
                auVar52._8_4_ = -(uint)(iVar11 < -0x7fffc8ca);
                auVar52._12_4_ = -(uint)(iVar11 < -0x7fffc8ca);
                auVar44._0_4_ = -(uint)(auVar41._4_4_ == -0x80000000);
                auVar44._4_4_ = -(uint)(auVar41._4_4_ == -0x80000000);
                auVar44._8_4_ = -(uint)(auVar41._12_4_ == -0x80000000);
                auVar44._12_4_ = -(uint)(auVar41._12_4_ == -0x80000000);
                auVar44 = auVar44 & auVar52;
                auVar41 = pshuflw(auVar48,auVar44,0xe8);
                auVar41 = packssdw(auVar41,auVar41);
                if ((auVar41 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  probs[lVar22 + -3] = 0x400;
                }
                auVar41 = packssdw(auVar44,auVar44);
                auVar41 = packssdw(auVar41,auVar41);
                if ((auVar41 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  probs[lVar22 + -2] = 0x400;
                }
                auVar41 = auVar40 ^ auVar54;
                iVar9 = auVar41._0_4_;
                iVar11 = auVar41._8_4_;
                auVar49._4_4_ = iVar9;
                auVar49._0_4_ = iVar9;
                auVar49._8_4_ = iVar11;
                auVar49._12_4_ = iVar11;
                auVar53._0_4_ = -(uint)(iVar9 < -0x7fffc8ca);
                auVar53._4_4_ = -(uint)(iVar9 < -0x7fffc8ca);
                auVar53._8_4_ = -(uint)(iVar11 < -0x7fffc8ca);
                auVar53._12_4_ = -(uint)(iVar11 < -0x7fffc8ca);
                auVar45._0_4_ = -(uint)(auVar41._4_4_ == -0x80000000);
                auVar45._4_4_ = -(uint)(auVar41._4_4_ == -0x80000000);
                auVar45._8_4_ = -(uint)(auVar41._12_4_ == -0x80000000);
                auVar45._12_4_ = -(uint)(auVar41._12_4_ == -0x80000000);
                auVar45 = auVar45 & auVar53;
                auVar41 = packssdw(auVar49,auVar45);
                auVar41 = packssdw(auVar41,auVar41);
                if ((auVar41 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  probs[lVar22 + -1] = 0x400;
                }
                auVar41 = pshufhw(auVar45,auVar45,0x84);
                auVar41 = packssdw(auVar41,auVar41);
                if ((auVar41 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  probs[lVar22] = 0x400;
                }
                lVar32 = auVar37._8_8_;
                auVar37._0_8_ = auVar37._0_8_ + 8;
                auVar37._8_8_ = lVar32 + 8;
                lVar32 = auVar38._8_8_;
                auVar38._0_8_ = auVar38._0_8_ + 8;
                auVar38._8_8_ = lVar32 + 8;
                lVar32 = auVar39._8_8_;
                auVar39._0_8_ = auVar39._0_8_ + 8;
                auVar39._8_8_ = lVar32 + 8;
                lVar32 = auVar40._8_8_;
                auVar40._0_8_ = auVar40._0_8_ + 8;
                auVar40._8_8_ = lVar32 + 8;
                lVar22 = lVar22 + 8;
              } while (lVar22 != 0x373f);
              local_74 = 0;
              local_64 = 0;
              local_54 = 0;
              local_88 = (uint16_t *)0x0;
              uVar29 = 0;
            }
            local_44 = 0xffffffff;
            uVar25 = uVar16 + 5;
            if (uVar25 <= compressed_size) {
              uVar31 = *(uint *)(compressed + uVar16 + 1);
              local_34 = uVar31 >> 0x18 | (uVar31 & 0xff0000) >> 8 | (uVar31 & 0xff00) << 8 |
                         uVar31 << 0x18;
              lVar22 = ((bVar3 & 0x1f) << 0x10) + uVar27;
              local_40 = uVar25;
              do {
                if ((ulong)(ushort)(uVar6 << 8 | uVar6 >> 8) + 1 + uVar25 <= local_40)
                goto LAB_001148f3;
                if (uVar27 == (ulong)bVar5 + lVar22 + (ulong)bVar4 * 0x100 + 1) {
                  iVar9 = 0xf;
                }
                else {
                  uVar20 = (uint)(uVar27 - local_100);
                  uVar30 = uVar20 & ~(-1 << sVar7);
                  uVar19 = uVar29 * 0x10 + uVar30;
                  iVar9 = elf_lzma_bit(compressed,compressed_size,probs + uVar19,&local_40,&local_44
                                       ,&local_34);
                  uVar31 = (uint)local_88;
                  if (iVar9 == 0) {
                    if (uVar27 == 0) {
                      uVar19 = 0;
                    }
                    else {
                      uVar19 = (uint)pbVar17[uVar27 - 1];
                    }
                    lVar32 = ((ulong)(uVar20 & ~(-1 << ((byte)uVar10 & 0x1f))) << (bVar18 & 0x3f)) +
                             (ulong)(uVar19 >> (8 - bVar18 & 0x1f));
                    if (uVar29 < 7) {
                      iVar9 = 8;
                      uVar24 = 1;
                      do {
                        iVar11 = elf_lzma_bit(compressed,compressed_size,
                                              probs + lVar32 * 0x300 + uVar24 + 0x736,&local_40,
                                              &local_44,&local_34);
                        uVar33 = iVar11 + (int)uVar24 * 2;
                        uVar24 = (ulong)uVar33;
                        iVar9 = iVar9 + -1;
                      } while (iVar9 != 0);
                      uVar33 = uVar33 - 0x100;
                    }
                    else {
                      uVar19 = 0;
                      if (uVar31 + 1 <= uVar27) {
                        uVar19 = (uint)pbVar17[~((ulong)local_88 & 0xffffffff) + uVar27] * 2;
                      }
                      uVar31 = 0x100;
                      uVar30 = 1;
                      do {
                        uVar20 = uVar31 & uVar19;
                        uVar19 = uVar19 * 2;
                        iVar9 = elf_lzma_bit(compressed,compressed_size,
                                             probs + lVar32 * 0x300 +
                                                     (ulong)(uVar30 + uVar31 + uVar20) + 0x736,
                                             &local_40,&local_44,&local_34);
                        if (iVar9 != 0) {
                          uVar31 = 0;
                        }
                        uVar33 = iVar9 + uVar30 * 2;
                        uVar31 = uVar31 ^ uVar20;
                        bVar35 = uVar30 < 0x80;
                        uVar30 = uVar33;
                      } while (bVar35);
                    }
                    uVar24 = uVar27;
                    if (uVar27 < size) {
                      pbVar17[uVar27] = (byte)uVar33;
                      uVar24 = uVar27 + 1;
                      if (uVar29 < 4) {
                        uVar29 = 0;
                      }
                      else if (uVar29 < 10) {
                        uVar29 = uVar29 - 3;
                      }
                      else {
                        uVar29 = uVar29 - 6;
                      }
                    }
                    iVar9 = 1;
                    bVar35 = size <= uVar27;
                    uVar27 = uVar24;
                    auVar54 = _DAT_00134040;
                    if (bVar35) goto LAB_00114332;
                  }
                  else {
                    iVar9 = elf_lzma_bit(compressed,compressed_size,probs + (uVar29 + 0xc0),
                                         &local_40,&local_44,&local_34);
                    if (iVar9 == 0) {
                      uVar19 = elf_lzma_len(compressed,compressed_size,probs,0,uVar30,&local_40,
                                            &local_44,&local_34);
                      uVar24 = (ulong)(uVar19 * 0x40 + 0x130);
                      if (5 < uVar19) {
                        uVar24 = 0x270;
                      }
                      iVar9 = 6;
                      uVar16 = 1;
                      do {
                        uVar30 = elf_lzma_bit(compressed,compressed_size,probs + uVar24 + uVar16,
                                              &local_40,&local_44,&local_34);
                        uVar20 = uVar30 + (int)uVar16 * 2;
                        uVar16 = (ulong)uVar20;
                        iVar9 = iVar9 + -1;
                      } while (iVar9 != 0);
                      uVar29 = (uint)(6 < uVar29) * 3 + 7;
                      uVar33 = uVar20 - 0x40;
                      if (uVar33 < 4) {
                        local_74 = local_64;
                        local_64 = local_54;
                        local_88 = (uint16_t *)(ulong)uVar33;
                        local_54 = uVar31;
                      }
                      else {
                        uVar30 = uVar30 | 2;
                        if (uVar33 < 0xe) {
                          iVar11 = (uVar33 >> 1) - 1;
                          iVar9 = uVar30 << ((byte)iVar11 & 0x1f);
                          if (iVar11 == 0) {
                            iVar34 = 0;
                          }
                          else {
                            iVar21 = 0;
                            uVar24 = 1;
                            iVar34 = 0;
                            do {
                              iVar12 = elf_lzma_bit(compressed,compressed_size,
                                                    probs + ((iVar9 - uVar20) + 0x2ef) + uVar24,
                                                    &local_40,&local_44,&local_34);
                              uVar24 = (ulong)(uint)(iVar12 + (int)uVar24 * 2);
                              iVar34 = iVar34 + (iVar12 << ((byte)iVar21 & 0x1f));
                              iVar21 = iVar21 + 1;
                            } while (iVar11 != iVar21);
                          }
                          uVar30 = iVar34 + iVar9;
                        }
                        else {
                          for (iVar9 = (uVar33 >> 1) - 5; iVar9 != 0; iVar9 = iVar9 + -1) {
                            if (local_40 < compressed_size && local_44 < 0x1000000) {
                              local_44 = local_44 << 8;
                              local_34 = local_34 << 8 | (uint)compressed[local_40];
                              local_40 = local_40 + 1;
                            }
                            local_44 = local_44 >> 1;
                            uVar20 = (int)(local_34 - local_44) >> 0x1f;
                            uVar30 = uVar20 + uVar30 * 2 + 1;
                            local_34 = (uVar20 & local_44) + (local_34 - local_44);
                          }
                          iVar9 = 0;
                          uVar24 = 1;
                          iVar11 = 0;
                          do {
                            iVar34 = elf_lzma_bit(compressed,compressed_size,probs + 0x322 + uVar24,
                                                  &local_40,&local_44,&local_34);
                            uVar24 = (ulong)(uint)(iVar34 + (int)uVar24 * 2);
                            iVar11 = iVar11 + (iVar34 << ((byte)iVar9 & 0x1f));
                            iVar9 = iVar9 + 1;
                          } while (iVar9 != 4);
                          uVar30 = iVar11 + uVar30 * 0x10;
                        }
                        local_74 = local_64;
                        local_64 = local_54;
                        local_88 = (uint16_t *)(ulong)uVar30;
                        local_54 = uVar31;
                      }
                    }
                    else {
                      iVar9 = elf_lzma_bit(compressed,compressed_size,probs + (uVar29 + 0xcc),
                                           &local_40,&local_44,&local_34);
                      if (iVar9 == 0) {
                        iVar9 = elf_lzma_bit(compressed,compressed_size,probs + (uVar19 + 0xf0),
                                             &local_40,&local_44,&local_34);
                        bVar35 = iVar9 != 0;
                        uVar19 = bVar35 ^ 9;
                        uVar31 = local_54;
                      }
                      else {
                        iVar9 = elf_lzma_bit(compressed,compressed_size,probs + (uVar29 + 0xd8),
                                             &local_40,&local_44,&local_34);
                        bVar35 = true;
                        if (iVar9 != 0) {
                          iVar9 = elf_lzma_bit(compressed,compressed_size,probs + (uVar29 + 0xe4),
                                               &local_40,&local_44,&local_34);
                          uVar19 = local_64;
                          if (iVar9 == 0) {
                            uVar19 = local_74;
                            local_74 = local_64;
                          }
                          local_64 = local_54;
                          local_54 = local_74;
                          local_74 = uVar19;
                        }
                        local_88 = (uint16_t *)(ulong)local_54;
                        uVar19 = 8;
                      }
                      bVar36 = 6 < uVar29;
                      uVar29 = uVar19;
                      if (bVar36) {
                        uVar29 = 0xb;
                      }
                      local_54 = uVar31;
                      if (bVar35) {
                        uVar19 = elf_lzma_len(compressed,compressed_size,probs,1,uVar30,&local_40,
                                              &local_44,&local_34);
                      }
                      else {
                        uVar19 = 1;
                      }
                    }
                    uVar31 = (int)local_88 + 1;
                    if (uVar27 - local_100 < (ulong)uVar31) {
LAB_001148e0:
                      bVar35 = false;
                    }
                    else {
                      uVar16 = (ulong)uVar19;
                      uVar24 = uVar27 + uVar16;
                      if (size < uVar24) goto LAB_001148e0;
                      if ((int)local_88 == 0) {
                        memset(pbVar17 + uVar27,(uint)pbVar17[uVar27 - 1],uVar16);
                        bVar35 = true;
                        uVar27 = uVar24;
                      }
                      else {
                        if (uVar31 < uVar19) {
                          do {
                            uVar24 = (ulong)uVar31;
                            if (uVar19 < uVar31) {
                              uVar24 = (ulong)uVar19;
                            }
                            memcpy(pbVar17 + uVar27,
                                   pbVar17 + uVar27 + (-1 - ((ulong)local_88 & 0xffffffff)),uVar24);
                            uVar27 = uVar27 + uVar24;
                            uVar19 = uVar19 - (int)uVar24;
                          } while (uVar19 != 0);
                        }
                        else {
                          memcpy(pbVar17 + uVar27,pbVar17 + uVar27 + ~((ulong)local_88 & 0xffffffff)
                                 ,uVar16);
                          uVar27 = uVar24;
                        }
                        bVar35 = true;
                      }
                    }
                    iVar9 = 1;
                    auVar54 = _DAT_00134040;
                    if (!bVar35) goto LAB_00114332;
                  }
                  iVar9 = 0;
                  auVar54 = _DAT_00134040;
                }
LAB_00114332:
              } while (iVar9 == 0);
              if (iVar9 == 0xf) {
LAB_001148f3:
                if ((local_44 < 0x1000000) && (local_40 < compressed_size)) {
                  local_44 = local_44 << 8;
                  local_34 = (uint)compressed[local_40] | local_34 << 8;
                  local_40 = local_40 + 1;
                }
                iVar9 = 0;
                uVar25 = local_40;
              }
              goto LAB_00114936;
            }
          }
          else {
            bVar15 = compressed[uVar24 + 5];
            sVar8 = 0;
            if (bVar15 < 0xe1) {
              if (0x2c < bVar15) {
                bVar18 = bVar15 - 0x2d;
                bVar15 = bVar18 % 0x2d;
                sVar8 = bVar18 / 0x2d + 1;
              }
              uVar10 = 0;
              if (9 < bVar15) {
                bVar18 = bVar15 - 10;
                bVar15 = bVar18 % 9 + 1;
                uVar10 = (uint)(byte)(bVar18 / 9 + 1);
              }
              bVar35 = bVar15 + uVar10 < 5;
              sVar7 = sVar8;
              bVar18 = bVar15;
            }
            else {
              bVar35 = false;
            }
            uVar16 = uVar24 + 6;
            if (bVar35) goto LAB_00113ea0;
          }
          local_34 = 0;
          local_44 = 0xffffffff;
          iVar9 = 1;
          uVar25 = uVar16;
        }
        else {
          iVar9 = 1;
        }
LAB_00114936:
        uVar24 = uVar25;
        if (iVar9 != 0) goto LAB_0011493c;
      }
      else {
        uVar16 = uVar25;
        if (bVar3 < 3) {
          uVar16 = uVar24 + 3;
          if (uVar16 <= compressed_size) {
            uVar24 = (ulong)(ushort)(*(ushort *)(compressed + uVar24 + 1) << 8 |
                                    *(ushort *)(compressed + uVar24 + 1) >> 8);
            uVar25 = uVar24 + uVar16 + 1;
            if (uVar25 <= compressed_size) {
              __n = uVar24 + 1;
              uVar24 = __n + uVar27;
              if (uVar24 <= size) {
                memcpy(pbVar17 + uVar27,compressed + uVar16,__n);
                bVar35 = true;
                uVar27 = uVar24;
                auVar54 = _DAT_00134040;
                goto LAB_00113dcf;
              }
            }
            goto LAB_00114949;
          }
          bVar35 = false;
        }
        else {
LAB_00114949:
          uVar25 = uVar16;
          bVar35 = false;
        }
LAB_00113dcf:
        if (!bVar35) {
          iVar9 = 1;
          uVar24 = uVar25;
          goto LAB_0011493c;
        }
      }
      iVar9 = 0;
      uVar24 = uVar25;
    }
LAB_0011493c:
  } while (iVar9 == 0);
  if (iVar9 != 6) goto LAB_00114a78;
LAB_0011497d:
  uVar25 = uVar24 + 3 & 0xfffffffffffffffc;
  if (compressed_size < uVar25) goto LAB_00114a78;
  if (bVar2 != 0) {
    if (bVar2 == 10) {
      uVar25 = uVar25 + 0x20;
    }
    else {
      if (bVar2 != 4) {
        if ((bVar2 != 1) || (compressed_size < uVar25 + 4)) goto LAB_00114a78;
        if ((long)uVar27 < 1) {
          uVar10 = 0;
        }
        else {
          uVar16 = 0xffffffffffffffff;
          pbVar26 = pbVar17;
          do {
            uVar10 = (uint)(uVar16 >> 8) & 0xffffff ^
                     *(uint *)(elf_crc32_crc32_table + (ulong)(byte)(*pbVar26 ^ (byte)uVar16) * 4);
            uVar16 = (ulong)uVar10;
            pbVar26 = pbVar26 + 1;
          } while (pbVar26 < pbVar17 + uVar27);
          uVar10 = ~uVar10;
        }
        puVar1 = compressed + uVar25;
        lVar22 = uVar25 + 2;
        uVar25 = uVar25 + 4;
        if (uVar10 != CONCAT13(compressed[uVar24 + 3 | 3],
                               CONCAT12(compressed[lVar22],*(undefined2 *)puVar1)))
        goto LAB_00114a78;
        goto LAB_00114a3c;
      }
      uVar25 = uVar25 + 8;
    }
    if (compressed_size < uVar25) goto LAB_00114a78;
  }
LAB_00114a3c:
  local_40 = uVar25;
  if ((uVar25 - 0xc == uVar28) && (uVar25 == uVar13)) {
    return 1;
  }
LAB_00114a78:
  tcmalloc_backtrace_free(state,pbVar17,size,error_callback,data);
  return 0;
}

Assistant:

static int
elf_uncompress_lzma (struct backtrace_state *state,
		     const unsigned char *compressed, size_t compressed_size,
		     backtrace_error_callback error_callback, void *data,
		     unsigned char **uncompressed, size_t *uncompressed_size)
{
  size_t header_size;
  size_t footer_size;
  unsigned char check;
  uint32_t computed_crc;
  uint32_t stream_crc;
  size_t offset;
  size_t index_size;
  size_t footer_offset;
  size_t index_offset;
  uint64_t index_compressed_size;
  uint64_t index_uncompressed_size;
  unsigned char *mem;
  uint16_t *probs;
  size_t compressed_block_size;

  /* The format starts with a stream header and ends with a stream
     footer.  */
  header_size = 12;
  footer_size = 12;
  if (unlikely (compressed_size < header_size + footer_size))
    {
      elf_uncompress_failed ();
      return 0;
    }

  /* The stream header starts with a magic string.  */
  if (unlikely (memcmp (compressed, "\375" "7zXZ\0", 6) != 0))
    {
      elf_uncompress_failed ();
      return 0;
    }

  /* Next come stream flags.  The first byte is zero, the second byte
     is the check.  */
  if (unlikely (compressed[6] != 0))
    {
      elf_uncompress_failed ();
      return 0;
    }
  check = compressed[7];
  if (unlikely ((check & 0xf8) != 0))
    {
      elf_uncompress_failed ();
      return 0;
    }

  /* Next comes a CRC of the stream flags.  */
  computed_crc = elf_crc32 (0, compressed + 6, 2);
  stream_crc = ((uint32_t)compressed[8]
		| ((uint32_t)compressed[9] << 8)
		| ((uint32_t)compressed[10] << 16)
		| ((uint32_t)compressed[11] << 24));
  if (unlikely (computed_crc != stream_crc))
    {
      elf_uncompress_failed ();
      return 0;
    }

  /* Now that we've parsed the header, parse the footer, so that we
     can get the uncompressed size.  */

  /* The footer ends with two magic bytes.  */

  offset = compressed_size;
  if (unlikely (memcmp (compressed + offset - 2, "YZ", 2) != 0))
    {
      elf_uncompress_failed ();
      return 0;
    }
  offset -= 2;

  /* Before that are the stream flags, which should be the same as the
     flags in the header.  */
  if (unlikely (compressed[offset - 2] != 0
		|| compressed[offset - 1] != check))
    {
      elf_uncompress_failed ();
      return 0;
    }
  offset -= 2;

  /* Before that is the size of the index field, which precedes the
     footer.  */
  index_size = (compressed[offset - 4]
		| (compressed[offset - 3] << 8)
		| (compressed[offset - 2] << 16)
		| (compressed[offset - 1] << 24));
  index_size = (index_size + 1) * 4;
  offset -= 4;

  /* Before that is a footer CRC.  */
  computed_crc = elf_crc32 (0, compressed + offset, 6);
  stream_crc = ((uint32_t)compressed[offset - 4]
		| ((uint32_t)compressed[offset - 3] << 8)
		| ((uint32_t)compressed[offset - 2] << 16)
		| ((uint32_t)compressed[offset - 1] << 24));
  if (unlikely (computed_crc != stream_crc))
    {
      elf_uncompress_failed ();
      return 0;
    }
  offset -= 4;

  /* The index comes just before the footer.  */
  if (unlikely (offset < index_size + header_size))
    {
      elf_uncompress_failed ();
      return 0;
    }

  footer_offset = offset;
  offset -= index_size;
  index_offset = offset;

  /* The index starts with a zero byte.  */
  if (unlikely (compressed[offset] != 0))
    {
      elf_uncompress_failed ();
      return 0;
    }
  ++offset;

  /* Next is the number of blocks.  We expect zero blocks for an empty
     stream, and otherwise a single block.  */
  if (unlikely (compressed[offset] == 0))
    {
      *uncompressed = NULL;
      *uncompressed_size = 0;
      return 1;
    }
  if (unlikely (compressed[offset] != 1))
    {
      elf_uncompress_failed ();
      return 0;
    }
  ++offset;

  /* Next is the compressed size and the uncompressed size.  */
  if (!elf_lzma_varint (compressed, compressed_size, &offset,
			&index_compressed_size))
    return 0;
  if (!elf_lzma_varint (compressed, compressed_size, &offset,
			&index_uncompressed_size))
    return 0;

  /* Pad to a four byte boundary.  */
  offset = (offset + 3) &~ (size_t) 3;

  /* Next is a CRC of the index.  */
  computed_crc = elf_crc32 (0, compressed + index_offset,
			    offset - index_offset);
  stream_crc = ((uint32_t)compressed[offset]
		| ((uint32_t)compressed[offset + 1] << 8)
		| ((uint32_t)compressed[offset + 2] << 16)
		| ((uint32_t)compressed[offset + 3] << 24));
  if (unlikely (computed_crc != stream_crc))
    {
      elf_uncompress_failed ();
      return 0;
    }
  offset += 4;

  /* We should now be back at the footer.  */
  if (unlikely (offset != footer_offset))
    {
      elf_uncompress_failed ();
      return 0;
    }

  /* Allocate space to hold the uncompressed data.  If we succeed in
     uncompressing the LZMA data, we never free this memory.  */
  mem = (unsigned char *) backtrace_alloc (state, index_uncompressed_size,
					   error_callback, data);
  if (unlikely (mem == NULL))
    return 0;
  *uncompressed = mem;
  *uncompressed_size = index_uncompressed_size;

  /* Allocate space for probabilities.  */
  probs = ((uint16_t *)
	   backtrace_alloc (state,
			    LZMA_PROB_TOTAL_COUNT * sizeof (uint16_t),
			    error_callback, data));
  if (unlikely (probs == NULL))
    {
      backtrace_free (state, mem, index_uncompressed_size, error_callback,
		      data);
      return 0;
    }

  /* Uncompress the block, which follows the header.  */
  offset = 12;
  if (!elf_uncompress_lzma_block (compressed, compressed_size, check, probs,
				  mem, index_uncompressed_size, &offset))
    {
      backtrace_free (state, mem, index_uncompressed_size, error_callback,
		      data);
      return 0;
    }

  compressed_block_size = offset - 12;
  if (unlikely (compressed_block_size
		!= ((index_compressed_size + 3) &~ (size_t) 3)))
    {
      elf_uncompress_failed ();
      backtrace_free (state, mem, index_uncompressed_size, error_callback,
		      data);
      return 0;
    }

  offset = (offset + 3) &~ (size_t) 3;
  if (unlikely (offset != index_offset))
    {
      elf_uncompress_failed ();
      backtrace_free (state, mem, index_uncompressed_size, error_callback,
		      data);
      return 0;
    }

  return 1;
}